

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * constQString(xmlTextReaderPtr reader,xmlChar *prefix,xmlChar *name)

{
  xmlChar *pxVar1;
  
  if (name == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlDictQLookup(reader->dict,prefix,name);
    if (pxVar1 == (xmlChar *)0x0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return pxVar1;
}

Assistant:

static const xmlChar *
constQString(xmlTextReaderPtr reader, const xmlChar *prefix,
             const xmlChar *name) {
    const xmlChar *dictString;

    if (name == NULL)
        return(NULL);

    dictString = xmlDictQLookup(reader->dict, prefix, name);
    if (dictString == NULL)
        xmlTextReaderErrMemory(reader);

    return(dictString);
}